

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O1

void __thiscall ItemTable::BlueRoomFive(ItemTable *this)

{
  ItemWrapper *this_00;
  ItemWrapper *this_01;
  ItemWrapper *this_02;
  mapped_type *ppIVar1;
  key_type local_104;
  string local_100;
  string local_e0;
  string local_c0;
  Item local_a0;
  Item local_78;
  Item local_50;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Stone Tablet","");
  Item::Item(&local_50,&local_c0,TABLET);
  ItemWrapper::ItemWrapper(this_00,&local_50,B_ROOM5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
    operator_delete(local_50.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  this_01 = (ItemWrapper *)operator_new(0x58);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Stone ","");
  Item::Item(&local_78,&local_e0,STATUE);
  ItemWrapper::ItemWrapper(this_01,&local_78,B_ROOM5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
    operator_delete(local_78.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  this_02 = (ItemWrapper *)operator_new(0x58);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Stone Box","");
  Item::Item(&local_a0,&local_100,BOX);
  ItemWrapper::ItemWrapper(this_02,&local_a0,HIDDEN);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
    operator_delete(local_a0.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  local_104 = TABLET;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_00;
  local_104 = STATUE;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_01;
  local_104 = BOX;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_02;
  return;
}

Assistant:

void ItemTable::BlueRoomFive() {

    ItemWrapper * StoneTablet = new ItemWrapper(Item("Stone Tablet", TABLET), B_ROOM5);
    ItemWrapper * statue    = new ItemWrapper(Item("Stone ", STATUE), B_ROOM5);
    ItemWrapper * box       = new ItemWrapper(Item("Stone Box", BOX), HIDDEN);

    items[TABLET] = StoneTablet;
    items[STATUE] = statue;
    items[BOX]    = box;

}